

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

BranchInstr * __thiscall
Lowerer::GenerateFastBrConst(Lowerer *this,BranchInstr *branchInstr,Opnd *constOpnd,bool isEqual)

{
  Lowerer *opnd;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  RegOpnd *compareSrc1;
  BranchInstr *pBVar5;
  char *this_00;
  
  OVar2 = IR::Opnd::GetKind(constOpnd);
  if (OVar2 != OpndKindAddr) {
    OVar2 = IR::Opnd::GetKind(constOpnd);
    if (OVar2 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xd1b,"(constOpnd->IsAddrOpnd() || constOpnd->IsIntConstOpnd())",
                         "constOpnd->IsAddrOpnd() || constOpnd->IsIntConstOpnd()");
      if (!bVar3) goto LAB_005c94c1;
      *puVar4 = 0;
    }
  }
  opnd = (Lowerer *)(branchInstr->super_Instr).m_src2;
  this_00 = (char *)opnd;
  OVar2 = IR::Opnd::GetKind((Opnd *)opnd);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
    ;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005c94c1;
    *puVar4 = 0;
  }
  bVar3 = IsConstRegOpnd((Lowerer *)this_00,(RegOpnd *)opnd);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
    ;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0xd28,"(IsConstRegOpnd(branchInstr->GetSrc2()->AsRegOpnd()))",
                       "IsConstRegOpnd(branchInstr->GetSrc2()->AsRegOpnd())");
    if (!bVar3) {
LAB_005c94c1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  compareSrc1 = GetRegOpnd((Lowerer *)this_00,(branchInstr->super_Instr).m_src1,
                           &branchInstr->super_Instr,this->m_func,TyVar);
  pBVar5 = InsertCompareBranch((Lowerer *)this_00,&compareSrc1->super_Opnd,constOpnd,
                               isEqual ^ BrNeq_A,false,branchInstr->m_branchTarget,
                               &branchInstr->super_Instr,false);
  return pBVar5;
}

Assistant:

IR::BranchInstr *
Lowerer::GenerateFastBrConst(IR::BranchInstr *branchInstr, IR::Opnd * constOpnd, bool isEqual)
{
    Assert(constOpnd->IsAddrOpnd() || constOpnd->IsIntConstOpnd());

    //
    // Given:
    // BrSrXx_A $L1, s1, s2
    // where s2 is either 'null', 'undefined', 'true' or 'false'
    //
    // Generate:
    //
    // CMP s1, s2
    // JEQ/JNE $L1
    //

    Assert(IsConstRegOpnd(branchInstr->GetSrc2()->AsRegOpnd()));

    IR::RegOpnd *opnd = GetRegOpnd(branchInstr->GetSrc1(), branchInstr, m_func, TyVar);

    IR::BranchInstr *newBranch;
    newBranch = InsertCompareBranch(opnd, constOpnd, isEqual ? Js::OpCode::BrEq_A : Js::OpCode::BrNeq_A, branchInstr->GetTarget(), branchInstr);

    return newBranch;
}